

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serial.c
# Opt level: O1

speed_t i2baud(int baud)

{
  if (baud < 0x1c200) {
    if (baud < 0x4b00) {
      if (baud == 0) {
        return 0;
      }
      if (baud == 0x2580) {
        return 0xd;
      }
    }
    else {
      if (baud == 0x4b00) {
        return 0xe;
      }
      if (baud == 0x9600) {
        return 0xf;
      }
      if (baud == 0xe100) {
        return 0x1001;
      }
    }
  }
  else if (baud < 0x70800) {
    if (baud == 0x1c200) {
      return 0x1002;
    }
    if (baud == 0x38400) {
      return 0x1003;
    }
  }
  else {
    if (baud == 0x70800) {
      return 0x1004;
    }
    if (baud == 0x8ca00) {
      return 0x1006;
    }
    if (baud == 0xe1000) {
      return 0x1007;
    }
  }
  return 0xffffffff;
}

Assistant:

speed_t i2baud(int baud)
{
  switch (baud)
  {
    case 0:
      return B0;
    case 9600:
      return B9600;
    case 19200:
      return B19200;
    case 38400:
      return B38400;
#ifdef B57600
    case 57600:
      return B57600;
#endif  // B57600
#ifdef B128000
    case 128000:
      return B128000;
#endif  // B128000
#ifdef B115200
    case 115200:
      return B115200;
#endif  // B115200
#ifdef B230400
    case 230400:
      return B230400;
#endif  // B230400
#ifdef B460800
    case 460800:
      return B460800;
#endif  // B460800
#ifdef B576000
    case 576000:
      return B576000;
#endif  // B576000
#ifdef B921600
    case 921600:
      return B921600;
#endif  // B921600
  }
  return -1;
}